

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cc
# Opt level: O3

int4 power2Divide(int4 n,uint8 divisor,uint8 *q,uint8 *r)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint8 uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint8 e;
  ulong uVar12;
  ulong uVar13;
  uint8 f;
  
  if (divisor == 0) {
    return 2;
  }
  bVar3 = (byte)n;
  if (n < 0x40) {
    uVar5 = 1L << (bVar3 & 0x3f);
    uVar6 = uVar5 / divisor;
    uVar8 = uVar5 % divisor;
    goto LAB_0021eb25;
  }
  uVar5 = divisor >> (bVar3 & 0x3f);
  if (uVar5 == 0) {
    return 1;
  }
  if (uVar5 == 1) {
    uVar11 = 1L << (bVar3 - 0x40 & 0x3f);
    uVar10 = 0xffffffffffffffff;
    uVar5 = 0x7fffffffffffffff;
    if (uVar11 == divisor) {
      return 1;
    }
LAB_0021e9f5:
    uVar7 = uVar5;
    do {
      uVar5 = uVar7 + uVar10 >> 1;
      uVar13 = uVar5 + 0x8000000000000000;
      if (!CARRY8(uVar7,uVar10)) {
        uVar13 = uVar5;
      }
      uVar6 = (uVar13 & 0xffffffff) * (divisor & 0xffffffff);
      uVar12 = (uVar13 >> 0x20) * (divisor & 0xffffffff);
      uVar5 = (uVar13 & 0xffffffff) * (divisor >> 0x20);
      uVar9 = (uVar5 & 0xffffffff) + (uVar12 & 0xffffffff) + (uVar6 >> 0x20);
      uVar12 = (uVar5 >> 0x20) + (uVar12 >> 0x20) + (uVar13 >> 0x20) * (divisor >> 0x20) +
               (uVar9 >> 0x20);
      uVar9 = uVar6 & 0xffffffff | uVar9 << 0x20;
      bVar4 = uVar9 != 0;
      if (uVar11 != uVar12) {
        bVar4 = uVar11 < uVar12;
      }
      uVar5 = uVar13;
      if (bVar4) {
        uVar10 = uVar13 - 1;
        uVar5 = uVar7;
      }
      uVar6 = uVar5 + 1;
      uVar7 = uVar5;
    } while (uVar6 < uVar10);
  }
  else {
    uVar12 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5 >> 1;
    uVar10 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / auVar1,0);
    uVar11 = 1L << (bVar3 - 0x40 & 0x3f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (uVar5 >> 1) + 1;
    uVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / auVar2,0);
    uVar5 = uVar6 - 1;
    if (uVar6 <= uVar10) {
      uVar10 = uVar10 + 1;
      goto LAB_0021e9f5;
    }
    uVar9 = 0;
    uVar13 = 0;
  }
  if (uVar13 != uVar5) {
    uVar13 = (uVar5 & 0xffffffff) * (divisor & 0xffffffff);
    uVar12 = (divisor & 0xffffffff) * (uVar5 >> 0x20);
    uVar10 = (uVar5 & 0xffffffff) * (divisor >> 0x20);
    uVar9 = (uVar10 & 0xffffffff) + (uVar12 & 0xffffffff) + (uVar13 >> 0x20);
    uVar12 = (uVar10 >> 0x20) + (uVar12 >> 0x20) + (uVar5 >> 0x20) * (divisor >> 0x20) +
             (uVar9 >> 0x20);
    uVar9 = uVar13 & 0xffffffff | uVar9 << 0x20;
  }
  if (-uVar9 < divisor && (-uVar12 - (ulong)(uVar9 != 0)) + uVar11 == 0) {
    divisor = 0;
    uVar6 = uVar5;
  }
  uVar8 = -uVar9 - divisor;
LAB_0021eb25:
  *q = uVar6;
  *r = uVar8;
  return 0;
}

Assistant:

int4 power2Divide(int4 n,uint8 divisor,uint8 &q,uint8 &r)

{
  if (divisor == 0) return 2;
  uint8 power = 1;
  if (n < 64) {
    power <<= n;
    q = power / divisor;
    r = power % divisor;
    return 0;
  }
  // Divide numerand and divisor by 2^(n-63) to get approximation of result
  uint8 y = divisor >> (n-64);	// Most of the way on divisor
  if (y == 0) return 1;		// Check if result will be too big
  y >>= 1;			// Divide divisor by final bit
  power <<= 63;
  uint8 max;
  if (y == 0) {
    max = 0;
    max -= 1;			// Could be maximal
    // Check if divisor is a power of 2
    if ((((uint8)1) << (n-64)) == divisor)
      return 1;
  }
  else
    max = power / y + 1;
  uint8 min = power / (y+1);
  if (min != 0)
    min -= 1;
  uint8 fullpower[2];
  fullpower[1] = ((uint8)1)<<(n-64);
  fullpower[0] = 0;
  uint8 mult[2];
  mult[0] = 0;
  mult[1] = 0;
  uint8 tmpq = 0;
  while(max > min+1) {
    tmpq = max + min;
    if (tmpq < min) {
      tmpq = (tmpq>>1) + 0x8000000000000000L;
    }
    else
      tmpq >>= 1;
    mult64to128(mult,divisor,tmpq);
    if (unsignedCompare128(fullpower,mult) < 0)
      max = tmpq-1;
    else
      min = tmpq;
  }
  // min is now our putative quotient
  if (tmpq != min)
    mult64to128(mult,divisor,min);
  unsignedSubtract128(fullpower,mult); // Calculate remainder
  // min might be 1 too small
  if (fullpower[1] != 0 || fullpower[0] >= divisor) {
    q = min + 1;
    r = fullpower[0] - divisor;
  }
  else {
    q = min;
    r = fullpower[0];
  }
  return 0;
}